

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O3

bool DirOpus(Disk *disk)

{
  pointer puVar1;
  int iVar2;
  int iVar3;
  Sector *pSVar4;
  Data *pDVar5;
  ulong uVar6;
  int iVar7;
  OPD_BOOT *ob;
  size_type *psVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  string name;
  int start;
  Format fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  ulong local_d0;
  ulong local_c8;
  int local_bc;
  uint local_b8;
  uint local_b4;
  string local_b0;
  int local_8c;
  Disk *local_88;
  ulong local_80;
  ulong local_78;
  Format local_6c;
  
  local_88 = disk;
  Format::Format(&local_6c,OPD);
  local_b4 = 1;
  local_b8 = 1;
  iVar12 = 0;
  uVar6 = 0;
  local_bc = 1;
  uVar10 = 0;
  do {
    Header::Header((Header *)&local_f0,0,0,(int)uVar10,1);
    pSVar4 = Disk::get_sector(local_88,(Header *)&local_f0);
    pDVar5 = Sector::data_copy(pSVar4,0);
    puVar1 = (pDVar5->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_80 = uVar10;
    if ((int)uVar10 == 0) {
      local_b4 = (uint)puVar1[2];
      local_b8 = (uint)puVar1[3];
      Format::Validate(local_b4,2 - (uint)((puVar1[4] & 0x10) == 0),local_b8,0x200,0);
    }
    else {
      iVar3 = Format::sector_size(&local_6c);
      iVar11 = iVar3 + 0xf;
      if (-1 < iVar3) {
        iVar11 = iVar3;
      }
      if (0xf < iVar3) {
        local_78 = (ulong)(uint)(iVar11 >> 4);
        local_8c = iVar12 + (iVar11 >> 4);
        psVar8 = (size_type *)(puVar1 + 6);
        iVar3 = 0;
        iVar11 = iVar12;
        do {
          local_c8 = (ulong)(iVar11 + 1U);
          uVar9 = (uint)*(byte *)((long)psVar8 + -4) | (*(byte *)((long)psVar8 + -3) & 0xf) << 8;
          local_d0 = uVar6;
          if (*(ushort *)((long)psVar8 + -2) == 0xffff) {
            iVar3 = local_bc * (int)local_78;
            uVar9 = uVar9 - (int)uVar6;
            iVar12 = Format::sector_size(&local_6c);
            util::fmt_abi_cxx11_
                      (&local_f0,"\n%u files, %u free slots\n%u blocks used, %u free (%uK)\n",
                       (ulong)(iVar11 - 1),(ulong)(iVar3 - (iVar11 + 1U)),(ulong)((int)uVar6 + 1),
                       (ulong)uVar9,(int)uVar9 / (int)(0x400 / (long)iVar12));
            util::operator<<((LogHelper *)&util::cout,&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_) ==
                &local_f0.field_2) {
              return true;
            }
            operator_delete((undefined1 *)
                            CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_
                                    ),local_f0.field_2._M_allocated_capacity + 1);
            return true;
          }
          iVar12 = *(ushort *)((long)psVar8 + -2) - uVar9;
          if ((int)local_80 == 1 && iVar3 == 0) {
            local_b0.field_2._8_2_ = (undefined2)psVar8[1];
            local_b0.field_2._M_allocated_capacity = *psVar8;
            local_b0._M_string_length = 10;
            local_b0.field_2._M_local_buf[10] = '\0';
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            util::trim(&local_f0,&local_b0);
            iVar7 = (int)local_d0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            util::fmt_abi_cxx11_
                      (&local_b0,"%.10s:\n\n",
                       CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_));
            iVar11 = (int)local_c8;
            util::operator<<((LogHelper *)&util::cout,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            iVar2 = iVar12;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_) !=
                &local_f0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_f0._M_dataplus._M_p._1_7_,
                                       local_f0._M_dataplus._M_p._0_1_),
                              local_f0.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0014a17a;
          }
          util::fmt_abi_cxx11_(&local_f0,"%-10.10s  ",psVar8);
          util::operator<<((LogHelper *)&util::cout,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_) !=
              &local_f0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_
                                    ),local_f0.field_2._M_allocated_capacity + 1);
          }
          uVar6 = (ulong)(uVar9 + 1) / (ulong)local_b8;
          Header::Header((Header *)&local_f0,(int)(uVar6 % (ulong)local_b4),(int)(uVar6 / local_b4),
                         (uVar9 + 1) % local_b8 + local_6c.base,1);
          pSVar4 = Disk::get_sector(local_88,(Header *)&local_f0);
          pDVar5 = Sector::data_copy(pSVar4,0);
          puVar1 = (pDVar5->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar6 = (ulong)*(ushort *)(puVar1 + 1);
          local_b0._M_dataplus._M_p._0_4_ = (uint)*(ushort *)(puVar1 + 3);
          switch(*puVar1) {
          case '\0':
            util::operator<<((LogHelper *)&util::cout,(char (*) [8])"BASIC  ");
            iVar7 = (int)local_d0;
            iVar11 = (int)local_c8;
            if ((int)(uint)local_b0._M_dataplus._M_p < 10000) {
              util::operator<<((LogHelper *)&util::cout,(int *)&local_b0);
            }
            goto LAB_0014a168;
          case '\x01':
            util::fmt_abi_cxx11_(&local_f0,"DATA   %c()",(ulong)((puVar1[4] & 0x3f) + 0x60),uVar6);
            util::operator<<((LogHelper *)&util::cout,&local_f0);
            break;
          case '\x02':
            util::fmt_abi_cxx11_(&local_f0,"DATA   %c$()",(ulong)((puVar1[4] & 0x3f) + 0x60),uVar6);
            util::operator<<((LogHelper *)&util::cout,&local_f0);
            break;
          case '\x03':
            util::fmt_abi_cxx11_
                      (&local_f0,"CODE   %5u,%u",(ulong)(uint)*(ushort *)(puVar1 + 3),uVar6);
            util::operator<<((LogHelper *)&util::cout,&local_f0);
            break;
          default:
            util::operator<<((LogHelper *)&util::cout,(char (*) [4])"???");
            iVar7 = (int)local_d0;
            iVar11 = (int)local_c8;
            goto LAB_0014a168;
          }
          iVar7 = (int)local_d0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_) !=
              &local_f0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_
                                    ),local_f0.field_2._M_allocated_capacity + 1);
          }
          iVar11 = (int)local_c8;
LAB_0014a168:
          local_f0._M_dataplus._M_p._0_1_ = 10;
          util::operator<<((LogHelper *)&util::cout,(char *)&local_f0);
          iVar2 = local_bc;
LAB_0014a17a:
          local_bc = iVar2;
          uVar6 = (ulong)(iVar7 + iVar12 + 1);
          iVar3 = iVar3 + 1;
          psVar8 = psVar8 + 2;
          iVar12 = local_8c;
        } while ((int)local_78 != iVar3);
      }
    }
    uVar10 = (ulong)((int)local_80 + 1);
    if (local_bc <= (int)local_80) {
      return true;
    }
  } while( true );
}

Assistant:

bool DirOpus(Disk& disk)
{
    Format fmt{ RegularFormat::OPD };

    auto cyls = 1, heads = 1, sectors = 1;
    auto uFiles = 0, uBlocks = 0;
    auto cat_blocks = 1;

    for (auto i = 0; i <= cat_blocks; ++i)
    {
        auto& sector = disk.get_sector(Header(0, 0, i, 1));
        auto& data = sector.data_copy();

        // First sector has disk geometry
        if (i == 0)
        {
            auto& ob = *reinterpret_cast<const OPD_BOOT*>(data.data());
            cyls = ob.cyls;
            heads = (ob.flags & 0x10) ? 2 : 1;
            sectors = ob.sectors;

            Format::Validate(cyls, heads, sectors);
            continue;
        }

        auto pd = reinterpret_cast<const OPUS_DIR*>(data.data());
        auto dir_entries = fmt.sector_size() / static_cast<int>(sizeof(OPUS_DIR));

        for (auto j = 0; j < dir_entries; ++j, ++pd)
        {
            // Extract the catalogue entry contents
            auto uFirstBlock = ((pd->first_block[1] & 0x0f) << 8) | pd->first_block[0];
            auto uLastBlock = (pd->last_block[1] << 8) | pd->last_block[0];
            //          auto uLastBlockSize = (pd->last_block_size[1] << 8) | pd->last_block_size[0];   // unused here

                        // Directory terminator?
            if (uLastBlock == 0xffff)
            {
                // Don't include catalogue and end marker in file count
                util::cout << util::fmt("\n%u files, %u free slots\n%u blocks used, %u free (%uK)\n",
                    uFiles - 1, cat_blocks * dir_entries - uFiles - 1, uBlocks + 1,
                    uFirstBlock - uBlocks, (uFirstBlock - uBlocks) / (1024 / fmt.sector_size()));
                return true;
            }

            ++uFiles;
            uBlocks += uLastBlock - uFirstBlock + 1;

            // The first entry in the catalogue is the label
            if (i == 1 && !j)
            {
                auto name = util::trim(std::string(pd->szName, sizeof(pd->szName)));
                util::cout << util::fmt("%.10s:\n\n", name.c_str());

                // Update the real number of blocks in the catalogue
                // The first block isn't directory, so subtract an extra 1
                cat_blocks = uLastBlock - uFirstBlock + 1 - 1;
                continue;
            }

            // Output the filename (we don't expand keywords yet)
            util::cout << util::fmt("%-10.10s  ", pd->szName);

            // ToDo: suppress extra info on physical disks, due to seek overhead?
//          if (true)
            {
                // Locate the first sector of the file, which starts with a header
                auto cyl = (++uFirstBlock / sectors) % cyls;
                auto head = (uFirstBlock / sectors) / cyls;
                auto sec = (uFirstBlock % sectors) + fmt.base;

                auto& sectorS = disk.get_sector(Header(cyl, head, sec, 1));
                auto& dataS = sectorS.data_copy();

                // Extract the file type, start and length
                auto type = dataS[0];
                auto length = (dataS[2] << 8) | dataS[1];
                auto start = (dataS[4] << 8) | dataS[3];
                //              auto uUnk = (dataS[6] << 8) | dataS[5];

                                // Display type-dependent information
                switch (type)
                {
                case 0: util::cout << "BASIC  "; if (start < 10000) util::cout << start; break;
                case 1: util::cout << util::fmt("DATA   %c()", 'a' + ((start & 0x3f00) >> 8) - 1); break;
                case 2: util::cout << util::fmt("DATA   %c$()", 'a' + ((start & 0x3f00) >> 8) - 1); break;
                case 3: util::cout << util::fmt("CODE   %5u,%u", start, length); break;
                default: util::cout << "???"; break;
                }
            }

            util::cout << '\n';
        }
    }

    return true;
}